

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

void __thiscall
QNetworkAccessManager::connectToHost(QNetworkAccessManager *this,QString *hostName,quint16 port)

{
  QNetworkAccessManagerPrivate *this_00;
  QNetworkReply *reply;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QUrl url;
  QNetworkRequest request;
  QUrl local_60;
  QNetworkRequest local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_60);
  QUrl::setHost((QString *)&local_60,(ParsingMode)hostName);
  QUrl::setPort((int)&local_60);
  QVar1.m_data = (storage_type *)0xf;
  QVar1.m_size = (qsizetype)local_58;
  QString::fromLatin1(QVar1);
  QUrl::setScheme((QString *)&local_60);
  if (local_58[0].d.d.ptr != (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0) {
    LOCK();
    *(int *)local_58[0].d.d.ptr = *(int *)local_58[0].d.d.ptr + -1;
    UNLOCK();
    if (*(int *)local_58[0].d.d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_58[0].d.d.ptr,2,0x10);
    }
  }
  local_58[0].d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest(local_58,&local_60);
  this_00 = *(QNetworkAccessManagerPrivate **)(this + 8);
  reply = (QNetworkReply *)(**(code **)(*(long *)this + 0x68))(this,2,local_58,0);
  QNetworkAccessManagerPrivate::postProcess(this_00,reply);
  QNetworkRequest::~QNetworkRequest(local_58);
  QUrl::~QUrl(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManager::connectToHost(const QString &hostName, quint16 port)
{
    QUrl url;
    url.setHost(hostName);
    url.setPort(port);
    url.setScheme("preconnect-http"_L1);
    QNetworkRequest request(url);
    get(request);
}